

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::SourceCodeInfo::ByteSizeLong(SourceCodeInfo *this)

{
  long lVar1;
  Rep *pRVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  void **ppvVar6;
  
  sVar5 = (size_t)(this->location_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->location_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  lVar1 = sVar5 * 8;
  for (lVar4 = 0; lVar1 - lVar4 != 0; lVar4 = lVar4 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo_Location>
                      (*(SourceCodeInfo_Location **)((long)ppvVar6 + lVar4));
    sVar5 = sVar5 + sVar3;
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar5,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t SourceCodeInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  total_size += 1UL * this->_internal_location_size();
  for (const auto& msg : this->location_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}